

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Deserializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP3Deserializer::ParsePGIndex
          (BP3Deserializer *this,BufferSTL *bufferSTL,string *hostLanguage)

{
  char cVar1;
  uint64_t uVar2;
  pointer pcVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint64_t uVar8;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar9;
  ProcessGroupIndex index;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  stepsFound;
  size_t local_f8;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_f0;
  ProcessGroupIndex local_e8;
  string local_88;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  lVar5 = *(long *)this;
  *(undefined8 *)(&this->field_0x1a0 + *(long *)(lVar5 + -0x18)) =
       *(undefined8 *)
        (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_f8 = 0x10;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  *(undefined8 *)(&this->field_0x1d0 + *(long *)(lVar5 + -0x18)) = 0;
  uVar8 = (this->m_Minifooter).VarsIndexStart - 0x10;
  uVar2 = (this->m_Minifooter).PGIndexStart;
  if (uVar8 != uVar2) {
    uVar6 = 0;
    do {
      BPBase::ReadProcessGroupIndexHeader
                (&local_e8,(BPBase *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18)),
                 &bufferSTL->m_Buffer,&local_f8,(this->m_Minifooter).IsLittleEndian);
      lVar5 = *(long *)this;
      if (local_e8.IsColumnMajor == 'y') {
        (&this->field_0x2f0)[*(long *)(lVar5 + -0x18)] = 0;
      }
      *(ulong *)(&this->field_0x1d8 + *(long *)(lVar5 + -0x18)) = (ulong)(local_e8.Step - 1);
      local_f0 = &local_68;
      pVar9 = std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&local_68,&local_e8.Step,&local_f0);
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        *(long *)(&this->field_0x1d0 + *(long *)(*(long *)this + -0x18)) =
             *(long *)(&this->field_0x1d0 + *(long *)(*(long *)this + -0x18)) + 1;
      }
      uVar7 = (ulong)local_e8.Length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.StepName._M_dataplus._M_p != &local_e8.StepName.field_2) {
        operator_delete(local_e8.StepName._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.Name._M_dataplus._M_p != &local_e8.Name.field_2) {
        operator_delete(local_e8.Name._M_dataplus._M_p);
      }
      uVar6 = uVar6 + uVar7 + 2;
    } while (uVar6 < uVar8 - uVar2);
    lVar5 = *(long *)this;
  }
  cVar1 = (&this->field_0x2f0)[*(long *)(lVar5 + -0x18)];
  pcVar3 = (hostLanguage->_M_dataplus)._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar3,pcVar3 + hostLanguage->_M_string_length);
  bVar4 = helper::IsRowMajor(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((bool)cVar1 != bVar4) {
    (&this->field_0x2f1)[*(long *)(*(long *)this + -0x18)] = 1;
  }
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void BP3Deserializer::ParsePGIndex(const BufferSTL &bufferSTL, const std::string hostLanguage)
{
    const auto &buffer = bufferSTL.m_Buffer;
    // always start from zero
    size_t position = 0;

    m_MetadataSet.DataPGCount =
        helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);
    helper::ReadValue<uint64_t>(buffer, position, m_Minifooter.IsLittleEndian);

    size_t localPosition = 0;

    std::unordered_set<uint32_t> stepsFound;
    m_MetadataSet.StepsCount = 0;

    /* Note: In ADIOS 1.x BP3 files, length is unreliable and is
     * probably smaller than the actual length of the PG index. Let's use
     * here the more reliable limit: the start of variable index - start of
     * PG index (- the already parsed 16 bytes)
     */
    const size_t pgIndexLength = m_Minifooter.VarsIndexStart - m_Minifooter.PGIndexStart - 16;

    while (localPosition < pgIndexLength)
    {
        ProcessGroupIndex index =
            ReadProcessGroupIndexHeader(buffer, position, m_Minifooter.IsLittleEndian);
        if (index.IsColumnMajor == 'y')
        {
            m_IsRowMajor = false;
        }

        m_MetadataSet.CurrentStep = static_cast<size_t>(index.Step - 1);

        // Count the number of unseen steps
        if (stepsFound.insert(index.Step).second)
        {
            ++m_MetadataSet.StepsCount;
        }

        localPosition += index.Length + 2;
    }

    if (m_IsRowMajor != helper::IsRowMajor(hostLanguage))
    {
        m_ReverseDimensions = true;
    }
}